

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_all_string_key(planck_unit_test_t *tc)

{
  int iVar1;
  uint uVar2;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_edge_cases);
  iVar1 = 0;
  for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
    sprintf(key,"k%d",(ulong)uVar2);
    local_ac = iVar1;
    bhdct_get(tc,&dict,key,&local_ac,'\0',1);
    iVar1 = iVar1 + 2;
  }
  iVar1 = 0xfa;
  for (uVar2 = 0x32; uVar2 < 100; uVar2 = uVar2 + 2) {
    sprintf(key,"k%d",(ulong)uVar2);
    local_b0 = iVar1;
    bhdct_get(tc,&dict,key,&local_b0,'\0',1);
    iVar1 = iVar1 + 10;
  }
  iVar1 = 5000;
  for (uVar2 = 500; uVar2 < 1000; uVar2 = uVar2 + 5) {
    sprintf(key,"k%d",(ulong)uVar2);
    local_b4 = iVar1;
    bhdct_get(tc,&dict,key,&local_b4,'\0',1);
    iVar1 = iVar1 + 0x32;
  }
  iVar1 = -300;
  for (uVar2 = 0xffffff9c; (int)uVar2 < -0x32; uVar2 = uVar2 + 2) {
    sprintf(key,"k%d",(ulong)uVar2);
    local_b8 = iVar1;
    bhdct_get(tc,&dict,key,&local_b8,'\0',1);
    iVar1 = iVar1 + 6;
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_all_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_LOW_VALUE(i), err_ok, 1);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_MEDIUM_VALUE(i), err_ok, 1);
	}
	ION_FILL_HIGH_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_HIGH_VALUE(i), err_ok, 1);
	}
	ION_FILL_EDGE_LOOP(i) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, ION_EDGE_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}